

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

void __thiscall
tcu::LogValueInfo::LogValueInfo
          (LogValueInfo *this,string *name,string *description,string *unit,qpSampleValueTag tag)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  std::__cxx11::string::string((string *)&this->m_unit,(string *)unit);
  this->m_tag = tag;
  return;
}

Assistant:

LogValueInfo (const std::string& name, const std::string& description, const std::string& unit, qpSampleValueTag tag)
		: m_name		(name)
		, m_description	(description)
		, m_unit		(unit)
		, m_tag			(tag)
	{
	}